

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O2

CURLcode AcceptServerConnect(connectdata *conn)

{
  SessionHandle *data;
  curl_sockopt_callback p_Var1;
  int iVar2;
  int iVar3;
  CURLcode CVar4;
  curl_socklen_t size;
  sockaddr_in add;
  
  data = conn->data;
  iVar3 = conn->sock[1];
  size = 0x10;
  iVar2 = getsockname(iVar3,(sockaddr *)&add,&size);
  if (iVar2 == 0) {
    size = 0x10;
    iVar2 = accept(iVar3,(sockaddr *)&add,&size);
  }
  else {
    iVar2 = -1;
  }
  Curl_closesocket(conn,iVar3);
  if (iVar2 == -1) {
    Curl_failf(data,"Error accept()ing server connect");
    CVar4 = CURLE_FTP_PORT_FAILED;
  }
  else {
    Curl_infof(data,"Connection accepted from server\n");
    conn->sock[1] = iVar2;
    curlx_nonblock(iVar2,1);
    conn->sock_accepted[1] = true;
    p_Var1 = (data->set).fsockopt;
    CVar4 = CURLE_OK;
    if ((p_Var1 != (curl_sockopt_callback)0x0) &&
       (iVar3 = (*p_Var1)((data->set).sockopt_client,iVar2,CURLSOCKTYPE_ACCEPT), CVar4 = CURLE_OK,
       iVar3 != 0)) {
      Curl_closesocket(conn,iVar2);
      conn->sock[1] = -1;
      CVar4 = CURLE_ABORTED_BY_CALLBACK;
    }
  }
  return CVar4;
}

Assistant:

static CURLcode AcceptServerConnect(struct connectdata *conn)
{
  struct SessionHandle *data = conn->data;
  curl_socket_t sock = conn->sock[SECONDARYSOCKET];
  curl_socket_t s = CURL_SOCKET_BAD;
#ifdef ENABLE_IPV6
  struct Curl_sockaddr_storage add;
#else
  struct sockaddr_in add;
#endif
  curl_socklen_t size = (curl_socklen_t) sizeof(add);

  if(0 == getsockname(sock, (struct sockaddr *) &add, &size)) {
    size = sizeof(add);

    s=accept(sock, (struct sockaddr *) &add, &size);
  }
  Curl_closesocket(conn, sock); /* close the first socket */

  if(CURL_SOCKET_BAD == s) {
    failf(data, "Error accept()ing server connect");
    return CURLE_FTP_PORT_FAILED;
  }
  infof(data, "Connection accepted from server\n");

  conn->sock[SECONDARYSOCKET] = s;
  curlx_nonblock(s, TRUE); /* enable non-blocking */
  conn->sock_accepted[SECONDARYSOCKET] = TRUE;

  if(data->set.fsockopt) {
    int error = 0;

    /* activate callback for setting socket options */
    error = data->set.fsockopt(data->set.sockopt_client,
                               s,
                               CURLSOCKTYPE_ACCEPT);

    if(error) {
      Curl_closesocket(conn, s); /* close the socket and bail out */
      conn->sock[SECONDARYSOCKET] = CURL_SOCKET_BAD;
      return CURLE_ABORTED_BY_CALLBACK;
    }
  }

  return CURLE_OK;

}